

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_dr_flac *
ma_dr_flac_open_with_metadata_private
          (ma_dr_flac_read_proc onRead,ma_dr_flac_seek_proc onSeek,ma_dr_flac_meta_proc onMeta,
          ma_dr_flac_container container,void *pUserData,void *pUserDataMD,
          ma_allocation_callbacks *pAllocationCallbacks)

{
  char *pcVar1;
  void *__dest;
  ushort *puVar2;
  uint uVar3;
  ma_dr_flac_seekpoint *pmVar4;
  ulong uVar5;
  ulong uVar6;
  _func_void_void_ptr_void_ptr *p_Var7;
  ma_dr_flac_bs *bs;
  ma_bool32 mVar8;
  ma_bool32 mVar9;
  ma_result mVar10;
  long lVar11;
  ma_dr_flac *pmVar12;
  ulong *puVar13;
  ulong *puVar14;
  uint *puVar15;
  uint *puVar16;
  ma_dr_flac *pFlac;
  ma_int32 *pmVar17;
  size_t sVar18;
  byte bVar19;
  int iVar20;
  char cVar21;
  ma_dr_flac_seek_origin extraout_EDX;
  ma_dr_flac_seek_origin extraout_EDX_00;
  ma_dr_flac_seek_origin extraout_EDX_01;
  ma_dr_flac_seek_origin mVar22;
  ma_dr_flac_seek_origin extraout_EDX_02;
  code *pcVar23;
  ulong *puVar24;
  ma_dr_flac_seek_proc p_Var25;
  uint uVar26;
  void *pvVar27;
  byte bVar28;
  uint uVar29;
  ma_uint32 mVar30;
  ma_uint8 *pNum_2;
  ulong uVar31;
  uint uVar32;
  ma_uint8 *pNum_1;
  ulong *puVar33;
  ulong *puVar34;
  _func_void_ptr_size_t_void_ptr *p_Var35;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [12];
  ma_uint8 id [4];
  ma_dr_flac_init_info init;
  ma_bool32 in_stack_ffffffffffffec98;
  undefined4 local_1364;
  void *local_1360;
  _func_void_void_ptr_void_ptr *local_1358;
  ma_dr_flac *local_1350;
  ma_dr_flac_seek_proc local_1348;
  ma_dr_flac_bs *local_1340;
  ulong *local_1338;
  byte local_1329;
  void *local_1328;
  _func_void_ptr_size_t_void_ptr *local_1320;
  ma_dr_flac_seek_proc local_1318;
  ulong *local_1310;
  _func_void_ptr_void_ptr_size_t_void_ptr *local_1308;
  ulong *local_1300;
  ma_dr_flac *local_12f8;
  ulong *local_12f0;
  ulong local_12e8;
  size_t local_12e0;
  ulong local_12d8;
  byte local_12d0;
  byte bStack_12cf;
  ushort uStack_12ce;
  ushort uStack_12cc;
  ulong *local_12c8;
  uint local_12c0;
  uint local_12b8;
  uint local_12b4;
  ulong *local_12b0;
  uint local_12a8;
  uint *local_12a0;
  uint local_1298;
  uint local_1294;
  uint local_1290;
  uint local_128c;
  uint local_1288;
  uint *local_1280;
  ulong local_1238;
  uint local_1230;
  byte local_122c;
  ulong *local_1228;
  ma_dr_flac_init_info local_1220;
  
  if (ma_dr_flac__init_cpu_caps()::isCPUCapsInitialized == '\0') {
    lVar11 = cpuid(0x80000001);
    ma_dr_flac__gIsLZCNTSupported = *(uint *)(lVar11 + 0xc) >> 5 & 1;
    ma_dr_flac__gIsSSE2Supported = 1;
    ma_dr_flac__init_cpu_caps()::isCPUCapsInitialized = '\x01';
  }
  local_1348 = (ma_dr_flac_seek_proc)onMeta;
  local_1340 = (ma_dr_flac_bs *)onRead;
  local_1318 = onSeek;
  mVar9 = 0;
  if (onSeek != (ma_dr_flac_seek_proc)0x0 && onRead != (ma_dr_flac_read_proc)0x0) {
    mVar9 = 0;
    memset(&local_1220,0,0x11f0);
    local_1220.onRead = (ma_dr_flac_read_proc)local_1340;
    local_1220.onSeek = local_1318;
    local_1220.onMeta = (ma_dr_flac_meta_proc)local_1348;
    local_1220.bs.onRead = (ma_dr_flac_read_proc)local_1340;
    local_1220.bs.onSeek = local_1318;
    local_1220.bs.nextL2Line = 0x200;
    local_1220.bs.consumedBits = 0x40;
    local_1220.bs.cache = 0;
    local_1220.bs.crc16Cache = 0;
    local_1220.bs.crc16CacheIgnoredBytes = 0;
    local_1220.bs.unalignedByteCount = 0;
    local_1220.bs.unalignedCache = 0;
    local_1360 = (void *)CONCAT44(local_1360._4_4_,container);
    local_1220.container = container;
    local_1220.pUserData = pUserData;
    local_1220.pUserDataMD = pUserDataMD;
    local_1220.bs.pUserData = pUserData;
    lVar11 = (*(code *)local_1340)(pUserData,&local_1364,4);
    if (lVar11 == 4) {
      local_1358 = (_func_void_void_ptr_void_ptr *)
                   CONCAT44(local_1358._4_4_,(uint)(container != ma_dr_flac_container_unknown));
      local_1328 = pUserDataMD;
      do {
        pUserDataMD = local_1328;
        local_1220.runningFilePos = local_1220.runningFilePos + 4;
        if ((((char)local_1364 != 'I') || (local_1364._1_1_ != 'D')) || (local_1364._2_1_ != '3')) {
          if (local_1364._3_1_ != 'C' ||
              (local_1364._2_1_ != 'a' || (local_1364._1_1_ != 'L' || (char)local_1364 != 'f'))) {
            if (local_1364._3_1_ != 'S' ||
                (local_1364._2_1_ != 'g' || (local_1364._1_1_ != 'g' || (char)local_1364 != 'O'))) {
              mVar9 = 0;
              if ((int)local_1360 == 2) break;
              if ((int)local_1360 != 1) {
                if ((int)local_1360 == 0) goto LAB_001774fb;
                break;
              }
            }
            mVar9 = ma_dr_flac__init_private__ogg
                              (&local_1220,(ma_dr_flac_read_proc)local_1340,local_1318,
                               (ma_dr_flac_meta_proc)local_1348,pUserData,local_1328,
                               in_stack_ffffffffffffec98);
            break;
          }
LAB_001774fb:
          mVar9 = ma_dr_flac__init_private__native
                            (&local_1220,(ma_dr_flac_read_proc)local_1340,local_1348,
                             (ma_dr_flac_meta_proc)pUserData,local_1328,
                             (void *)((ulong)local_1358 & 0xffffffff),in_stack_ffffffffffffec98);
          break;
        }
        lVar11 = (*(code *)local_1340)(pUserData,&local_12d0,6);
        pUserDataMD = local_1328;
        if (lVar11 != 6) break;
        local_1220.runningFilePos = local_1220.runningFilePos + 6;
        uVar26 = (((uStack_12cc & 0xff) << 0x10) >> 8 & 0x7f00) >> 1;
        uVar32 = uVar26 + 10;
        if ((bStack_12cf & 0x10) == 0) {
          uVar32 = uVar26;
        }
        uVar32 = uVar32 + (((uStack_12cc & 0x7f00) << 0x10) >> 0x18 |
                           ((uStack_12ce & 0x7f00) << 8) >> 2 | ((uStack_12ce & 0x7f) << 0x18) >> 3)
        ;
        mVar8 = (*local_1318)(pUserData,uVar32,ma_dr_flac_seek_origin_current);
        pUserDataMD = local_1328;
        if (mVar8 == 0) break;
        local_1220.runningFilePos = local_1220.runningFilePos + uVar32;
        lVar11 = (*(code *)local_1340)(pUserData,&local_1364,4);
        pUserDataMD = local_1328;
      } while (lVar11 == 4);
    }
  }
  p_Var25 = local_1348;
  if (mVar9 == 0) {
    return (ma_dr_flac *)0x0;
  }
  if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
    local_1320 = ma_dr_flac__malloc_default;
    pcVar23 = ma_dr_flac__realloc_default;
    local_1358 = ma_dr_flac__free_default;
    local_1360 = (void *)0x0;
  }
  else {
    local_1358 = pAllocationCallbacks->onFree;
    if (local_1358 == (_func_void_void_ptr_void_ptr *)0x0) {
      return (ma_dr_flac *)0x0;
    }
    pcVar23 = pAllocationCallbacks->onRealloc;
    local_1320 = pAllocationCallbacks->onMalloc;
    if (local_1320 == (_func_void_ptr_size_t_void_ptr *)0x0 &&
        pcVar23 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
      return (ma_dr_flac *)0x0;
    }
    local_1360 = pAllocationCallbacks->pUserData;
  }
  uVar32 = (uint)local_1220.channels *
           (((local_1220.maxBlockSizeInPCMFrames >> 4) + 1) -
           (uint)((local_1220.maxBlockSizeInPCMFrames & 0xf) == 0)) * 0x40;
  uVar31 = 0;
  local_1328 = pUserDataMD;
  if (local_1220.container == ma_dr_flac_container_ogg) {
    if (local_1320 == (_func_void_ptr_size_t_void_ptr *)0x0) {
      if (pcVar23 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
        pmVar12 = (ma_dr_flac *)0x0;
      }
      else {
        pmVar12 = (ma_dr_flac *)(*pcVar23)((void *)0x0,0x10198,local_1360);
      }
    }
    else {
      pmVar12 = (ma_dr_flac *)(*local_1320)(0x10198,local_1360);
    }
    if (pmVar12 == (ma_dr_flac *)0x0) {
      return (ma_dr_flac *)0x0;
    }
    local_12e8 = (ulong)(uVar32 + 0x11360);
    memset(pmVar12,0,0x10198);
    pmVar12->onMeta = (ma_dr_flac_meta_proc)local_1340;
    pmVar12->pUserDataMD = local_1318;
    (pmVar12->allocationCallbacks).pUserData = pUserData;
    (pmVar12->allocationCallbacks).onMalloc =
         (_func_void_ptr_size_t_void_ptr *)local_1220.oggFirstBytePos;
    (pmVar12->allocationCallbacks).onRealloc =
         (_func_void_ptr_void_ptr_size_t_void_ptr *)local_1220.oggFirstBytePos;
    *(ma_uint32 *)&(pmVar12->allocationCallbacks).onFree = local_1220.oggSerial;
    memcpy(&pmVar12->sampleRate,&local_1220.oggBosHeader,0x120);
    *(undefined4 *)((pmVar12->bs).cacheL2 + 0x22) = 0;
    local_12f8 = pmVar12;
  }
  else {
    local_12e8 = (ulong)(uVar32 + 0x11c8);
    local_12f8 = (ma_dr_flac *)0x0;
  }
  local_1308 = pcVar23;
  local_12d8 = (ulong)uVar32;
  if (local_1220.hasMetadataBlocks == 0) {
    local_1338 = (ulong *)0x2a;
    local_1310 = (ulong *)0x0;
    uVar32 = (uint)local_12e8;
    pmVar12 = local_12f8;
    p_Var35 = local_1320;
  }
  else {
    if (local_1220.container == ma_dr_flac_container_ogg) {
      local_1340 = (ma_dr_flac_bs *)ma_dr_flac__on_read_ogg;
      local_1318 = ma_dr_flac__on_seek_ogg;
      pUserData = local_12f8;
    }
    puVar34 = (ulong *)0x2a;
    local_12f0 = (ulong *)0x0;
    local_1310 = (ulong *)0x0;
    local_1350 = (ma_dr_flac *)pUserData;
    do {
      lVar11 = (*(code *)local_1340)(pUserData,&local_1364,4);
      uVar32 = 0;
      bVar19 = 0;
      puVar24 = (ulong *)0x0;
      if (lVar11 == 4) {
        uVar32 = (local_1364 << 0x18) >> 0x1f;
        bVar19 = (byte)local_1364 & 0x7f;
        puVar24 = (ulong *)(ulong)(local_1364 >> 0x18 | (local_1364 & 0xff0000) >> 8 |
                                  (local_1364 & 0xff00) << 8);
      }
      iVar20 = 1;
      uVar26 = (uint)puVar24;
      if (lVar11 != 4) goto LAB_00177be2;
      puVar34 = (ulong *)((long)puVar34 + 4);
      bStack_12cf = 0;
      uStack_12ce = 0;
      local_12c8 = (ulong *)0x0;
      local_12c0 = 0;
      mVar22 = 0x19e138;
      puVar13 = local_1310;
      puVar14 = local_12f0;
      local_12d0 = bVar19;
      switch(bVar19) {
      case 1:
        if (p_Var25 != (ma_dr_flac_seek_proc)0x0) {
          local_12b8 = 0;
          mVar9 = (*local_1318)(pUserData,uVar26,ma_dr_flac_seek_origin_current);
          if (mVar9 == 0) {
            uVar32 = 1;
            puVar13 = local_1310;
            puVar14 = local_12f0;
          }
          else {
            (*p_Var25)(local_1328,(int)&local_12d0,extraout_EDX);
            puVar13 = local_1310;
            puVar14 = local_12f0;
          }
        }
        goto LAB_00177bb1;
      case 2:
        if (3 < uVar26) {
          if (p_Var25 != (ma_dr_flac_seek_proc)0x0) {
            if (local_1320 == (_func_void_ptr_size_t_void_ptr *)0x0) {
              if (local_1308 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
                puVar13 = (ulong *)0x0;
              }
              else {
                puVar13 = (ulong *)(*local_1308)((void *)0x0,(size_t)puVar24,local_1360);
              }
            }
            else {
              puVar13 = (ulong *)(*local_1320)((size_t)puVar24,local_1360);
            }
            pUserData = local_1350;
            if (puVar13 == (ulong *)0x0) goto LAB_00177d0b;
            auVar37 = (*(code *)local_1340)(local_1350,puVar13,puVar24);
            lVar11 = auVar37._8_8_;
            if (auVar37._0_8_ != puVar24) goto LAB_00177cf5;
            uVar29 = (uint)*puVar13;
            local_12b8 = uVar29 >> 0x18 | (uVar29 & 0xff0000) >> 8 | (uVar29 & 0xff00) << 8 |
                         uVar29 << 0x18;
            local_12b0 = (ulong *)((long)puVar13 + 4);
            local_12a8 = uVar26 - 4;
LAB_00177b8c:
            local_12c8 = puVar13;
            puVar13 = local_12c8;
            local_12c0 = uVar26;
            (*p_Var25)(local_1328,(int)&local_12d0,(ma_dr_flac_seek_origin)lVar11);
LAB_00177b9e:
            (*local_1358)(puVar13,local_1360);
            pUserData = local_1350;
            puVar13 = local_1310;
            puVar14 = local_12f0;
          }
          goto LAB_00177bb1;
        }
        break;
      case 3:
        puVar13 = puVar34;
        puVar14 = puVar24;
        if (p_Var25 != (ma_dr_flac_seek_proc)0x0) {
          iVar20 = (int)((ulong)puVar24 / 0x12);
          uVar31 = (ulong)(uint)(iVar20 * 0x18);
          if (local_1320 == (_func_void_ptr_size_t_void_ptr *)0x0) {
            if (local_1308 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
              puVar13 = (ulong *)0x0;
            }
            else {
              puVar13 = (ulong *)(*local_1308)((void *)0x0,uVar31,local_1360);
              mVar22 = extraout_EDX_01;
            }
          }
          else {
            puVar13 = (ulong *)(*local_1320)(uVar31,local_1360);
            mVar22 = extraout_EDX_00;
          }
          if (puVar13 == (ulong *)0x0) {
LAB_00177d1f:
            iVar20 = 1;
            p_Var25 = local_1348;
            pUserData = local_1350;
            local_1310 = puVar34;
            local_12f0 = puVar24;
            break;
          }
          local_1338 = puVar34;
          local_1310 = (ulong *)((ulong)puVar24 / 0x12);
          if (0x11 < uVar26) {
            lVar11 = 0;
            do {
              auVar38 = (*(code *)local_1340)(local_1350,(long)puVar13 + lVar11,0x12);
              mVar22 = auVar38._8_4_;
              if (auVar38._0_8_ != 0x12) {
                (*local_1358)(puVar13,local_1360);
                puVar34 = local_1338;
                goto LAB_00177d1f;
              }
              uVar31 = *(ulong *)((long)puVar13 + lVar11);
              uVar5 = *(ulong *)((long)puVar13 + lVar11 + 8);
              *(ulong *)((long)puVar13 + lVar11) =
                   uVar31 >> 0x38 | (uVar31 & 0xff000000000000) >> 0x28 |
                   (uVar31 & 0xff0000000000) >> 0x18 | (uVar31 & 0xff00000000) >> 8 |
                   (uVar31 & 0xff000000) << 8 | (uVar31 & 0xff0000) << 0x18 |
                   (uVar31 & 0xff00) << 0x28 | uVar31 << 0x38;
              *(ulong *)((long)puVar13 + lVar11 + 8) =
                   uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 |
                   (uVar5 & 0xff0000000000) >> 0x18 | (uVar5 & 0xff00000000) >> 8 |
                   (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 | (uVar5 & 0xff00) << 0x28
                   | uVar5 << 0x38;
              puVar2 = (ushort *)((long)puVar13 + lVar11 + 0x10);
              *puVar2 = *puVar2 << 8 | *puVar2 >> 8;
              lVar11 = lVar11 + 0x18;
            } while ((ulong)(uint)(iVar20 * 8) * 3 != lVar11);
          }
          p_Var25 = local_1348;
          local_12b8 = (uint)local_1310;
          local_12c8 = puVar13;
          local_12c0 = uVar26;
          local_12b0 = puVar13;
          (*local_1348)(local_1328,(int)&local_12d0,mVar22);
          (*local_1358)(puVar13,local_1360);
          local_1310 = local_1338;
          pUserData = local_1350;
          puVar34 = local_1338;
          puVar13 = local_1310;
        }
        goto LAB_00177bb1;
      case 4:
        if (7 < uVar26) {
          if (p_Var25 != (ma_dr_flac_seek_proc)0x0) {
            if (local_1320 == (_func_void_ptr_size_t_void_ptr *)0x0) {
              if (local_1308 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
                puVar13 = (ulong *)0x0;
              }
              else {
                puVar13 = (ulong *)(*local_1308)((void *)0x0,(size_t)puVar24,local_1360);
              }
            }
            else {
              puVar13 = (ulong *)(*local_1320)((size_t)puVar24,local_1360);
            }
            if (puVar13 != (ulong *)0x0) {
              local_1338 = puVar13;
              puVar14 = (ulong *)(*(code *)local_1340)(pUserData,puVar13,puVar24);
              puVar13 = local_1338;
              p_Var25 = local_1348;
              if (puVar14 == puVar24) {
                local_12c8 = local_1338;
                local_12b8 = (uint)*local_1338;
                uVar31 = (ulong)local_12b8;
                if ((long)(puVar24 + -1) < (long)uVar31) {
                  local_12c0 = uVar26;
                  (*local_1358)(local_1338,local_1360);
                }
                else {
                  puVar14 = (ulong *)((long)puVar24 + (long)local_1338);
                  local_12b0 = (ulong *)((long)local_1338 + 4);
                  puVar15 = (uint *)((long)local_1338 + uVar31 + 8);
                  local_12a8 = *(uint *)((long)local_1338 + uVar31 + 4);
                  if ((ulong)local_12a8 <= (ulong)((long)puVar14 - (long)puVar15) >> 2) {
                    local_12c0 = uVar26;
                    local_12a0 = puVar15;
                    if (local_12a8 != 0) {
                      uVar29 = 0;
                      local_1300 = puVar14;
                      do {
                        if ((long)local_1300 - (long)puVar15 < 4) {
LAB_00177ff1:
                          (*local_1358)(puVar13,local_1360);
                          bVar36 = false;
                        }
                        else {
                          uVar3 = *puVar15;
                          puVar15 = puVar15 + 1;
                          if ((long)local_1300 - (long)puVar15 < (long)(ulong)uVar3)
                          goto LAB_00177ff1;
                          puVar15 = (uint *)((long)puVar15 + (ulong)uVar3);
                          bVar36 = true;
                        }
                        pUserData = local_1350;
                        if (!bVar36) goto LAB_00177f16;
                        uVar29 = uVar29 + 1;
                        puVar14 = local_1300;
                      } while (uVar29 < local_12a8);
                    }
                    p_Var25 = local_1348;
                    (*local_1348)(local_1328,(int)&local_12d0,(ma_dr_flac_seek_origin)puVar14);
                    goto LAB_00177b9e;
                  }
                  local_12c0 = uVar26;
                  (*local_1358)(local_1338,local_1360);
                  pUserData = local_1350;
                }
                goto LAB_00177d0b;
              }
LAB_00177f08:
              (*local_1358)(puVar13,local_1360);
            }
            goto LAB_00177f16;
          }
          goto LAB_00177bb1;
        }
        break;
      case 5:
        if (0x18b < uVar26) {
          if (p_Var25 == (ma_dr_flac_seek_proc)0x0) goto LAB_00177bb1;
          if (local_1320 == (_func_void_ptr_size_t_void_ptr *)0x0) {
            if (local_1308 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
              puVar13 = (ulong *)0x0;
            }
            else {
              puVar13 = (ulong *)(*local_1308)((void *)0x0,(size_t)puVar24,local_1360);
            }
          }
          else {
            puVar13 = (ulong *)(*local_1320)((size_t)puVar24,local_1360);
          }
          if (puVar13 != (ulong *)0x0) {
            local_1300 = puVar13;
            puVar14 = (ulong *)(*(code *)local_1340)(pUserData,puVar13,puVar24);
            puVar13 = local_1300;
            local_1338 = puVar24;
            if (puVar14 != puVar24) goto LAB_00177f08;
            local_12c8 = local_1300;
            local_12c0 = uVar26;
            memcpy(&local_12b8,local_1300,0x80);
            uVar31 = puVar13[0x10];
            local_1238 = uVar31 >> 0x38 | (uVar31 & 0xff000000000000) >> 0x28 |
                         (uVar31 & 0xff0000000000) >> 0x18 | (uVar31 & 0xff00000000) >> 8 |
                         (uVar31 & 0xff000000) << 8 | (uVar31 & 0xff0000) << 0x18 |
                         (uVar31 & 0xff00) << 0x28 | uVar31 << 0x38;
            local_1230 = (uint)(byte)((byte)puVar13[0x11] >> 7);
            local_122c = *(byte *)((long)puVar13 + 0x18b);
            puVar14 = (ulong *)((long)puVar13 + 0x18c);
            local_1228 = (ulong *)0x0;
            local_12e0 = (ulong)((uint)local_122c * 4) * 9;
            puVar33 = puVar14;
            bVar19 = local_122c != 0;
            if (local_122c != 0) {
              local_1338 = (ulong *)((long)local_1338 + (long)puVar13);
              bVar19 = true;
              bVar28 = 0;
              puVar13 = puVar14;
              do {
                local_1329 = bVar19;
                if ((long)local_1338 - (long)puVar13 < 0x24) {
LAB_00177e53:
                  (*local_1358)(local_1300,local_1360);
                  bVar36 = false;
                }
                else {
                  bVar19 = *(byte *)((long)puVar13 + 0x23);
                  puVar13 = (ulong *)((long)puVar13 + 0x24);
                  local_12e0 = local_12e0 + (ulong)bVar19 * 0x10;
                  lVar11 = (ulong)bVar19 * 0xc;
                  if (SBORROW8((long)local_1338 - (long)puVar13,lVar11) !=
                      (long)(((long)local_1338 - (long)puVar13) + (ulong)bVar19 * -0xc) < 0)
                  goto LAB_00177e53;
                  puVar13 = (ulong *)((long)puVar13 + lVar11);
                  bVar36 = true;
                }
                puVar33 = puVar13;
                bVar19 = local_1329;
                if (!bVar36) break;
                bVar28 = bVar28 + 1;
                bVar19 = bVar28 < local_122c;
                puVar33 = puVar14;
              } while ((bool)bVar19);
            }
            pUserData = local_1350;
            if ((bVar19 & 1) == 0) {
              if (local_1320 == (_func_void_ptr_size_t_void_ptr *)0x0) {
                if (local_1308 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
                  puVar13 = (ulong *)0x0;
                }
                else {
                  puVar13 = (ulong *)(*local_1308)((void *)0x0,local_12e0,local_1360);
                }
              }
              else {
                puVar13 = (ulong *)(*local_1320)(local_12e0,local_1360);
              }
              p_Var25 = local_1348;
              if (puVar13 == (ulong *)0x0) {
                (*local_1358)(local_1300,local_1360);
              }
              else {
                local_1228 = puVar13;
                if (local_122c != 0) {
                  bVar19 = 0;
                  puVar14 = puVar13;
                  do {
                    *(uint *)(puVar14 + 4) = (uint)puVar33[4];
                    uVar31 = *puVar33;
                    uVar5 = puVar33[1];
                    uVar6 = puVar33[3];
                    puVar14[2] = puVar33[2];
                    puVar14[3] = uVar6;
                    *puVar14 = uVar31;
                    puVar14[1] = uVar5;
                    pcVar1 = (char *)((long)puVar33 + 0x23);
                    puVar33 = (ulong *)((long)puVar33 + 0x24);
                    puVar14 = (ulong *)((long)puVar14 + 0x24);
                    for (cVar21 = *pcVar1; cVar21 != '\0'; cVar21 = cVar21 + -1) {
                      uVar31 = *puVar33;
                      *puVar14 = uVar31;
                      *(uint *)(puVar14 + 1) = (uint)puVar33[1];
                      puVar33 = (ulong *)((long)puVar33 + 0xc);
                      *puVar14 = uVar31 >> 0x38 | (uVar31 & 0xff000000000000) >> 0x28 |
                                 (uVar31 & 0xff0000000000) >> 0x18 | (uVar31 & 0xff00000000) >> 8 |
                                 (uVar31 & 0xff000000) << 8 | (uVar31 & 0xff0000) << 0x18 |
                                 (uVar31 & 0xff00) << 0x28 | uVar31 << 0x38;
                      puVar14 = puVar14 + 2;
                    }
                    bVar19 = bVar19 + 1;
                  } while (bVar19 < local_122c);
                }
              }
              pUserData = local_1350;
              pvVar27 = local_1360;
              iVar20 = 1;
              if (puVar13 == (ulong *)0x0) break;
              local_1338 = puVar13;
              (*local_1358)(local_1300,local_1360);
              (*p_Var25)(local_1328,(int)&local_12d0,extraout_EDX_02);
              (*local_1358)(local_1338,pvVar27);
              puVar13 = local_1310;
              puVar14 = local_12f0;
              goto LAB_00177bb1;
            }
          }
LAB_00177f16:
          iVar20 = 1;
          p_Var25 = local_1348;
        }
        break;
      case 6:
        if (0x1f < uVar26) {
          if (p_Var25 == (ma_dr_flac_seek_proc)0x0) goto LAB_00177bb1;
          if (local_1320 == (_func_void_ptr_size_t_void_ptr *)0x0) {
            if (local_1308 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
              puVar13 = (ulong *)0x0;
            }
            else {
              puVar13 = (ulong *)(*local_1308)((void *)0x0,(size_t)puVar24,local_1360);
            }
          }
          else {
            puVar13 = (ulong *)(*local_1320)((size_t)puVar24,local_1360);
          }
          pUserData = local_1350;
          if (puVar13 != (ulong *)0x0) {
            puVar14 = (ulong *)(*(code *)local_1340)(local_1350,puVar13,puVar24);
            if (puVar14 == puVar24) {
              uVar29 = (uint)*puVar13;
              local_12b8 = uVar29 >> 0x18 | (uVar29 & 0xff0000) >> 8 | (uVar29 & 0xff00) << 8 |
                           uVar29 << 0x18;
              uVar29 = *(uint *)((long)puVar13 + 4);
              local_12b4 = uVar29 >> 0x18 | (uVar29 & 0xff0000) >> 8 | (uVar29 & 0xff00) << 8 |
                           uVar29 << 0x18;
              uVar31 = (ulong)local_12b4;
              local_12c8 = puVar13;
              local_12c0 = uVar26;
              if ((long)uVar31 <= (long)(puVar24 + -4)) {
                local_12b0 = puVar13 + 1;
                puVar15 = (uint *)((long)puVar13 + uVar31 + 0xc);
                uVar29 = *(uint *)((long)puVar13 + uVar31 + 8);
                local_12a8 = uVar29 >> 0x18 | (uVar29 & 0xff0000) >> 8 | (uVar29 & 0xff00) << 8 |
                             uVar29 << 0x18;
                lVar11 = (((long)puVar24 + (long)puVar13) - (long)puVar15) + -0x14;
                if ((long)(ulong)local_12a8 <= lVar11) {
                  puVar16 = (uint *)((long)puVar15 + (ulong)local_12a8);
                  local_1280 = puVar16 + 5;
                  uVar29 = *puVar16;
                  local_1298 = uVar29 >> 0x18 | (uVar29 & 0xff0000) >> 8 | (uVar29 & 0xff00) << 8 |
                               uVar29 << 0x18;
                  uVar29 = puVar16[1];
                  local_1294 = uVar29 >> 0x18 | (uVar29 & 0xff0000) >> 8 | (uVar29 & 0xff00) << 8 |
                               uVar29 << 0x18;
                  uVar29 = puVar16[2];
                  local_1290 = uVar29 >> 0x18 | (uVar29 & 0xff0000) >> 8 | (uVar29 & 0xff00) << 8 |
                               uVar29 << 0x18;
                  uVar29 = puVar16[3];
                  local_128c = uVar29 >> 0x18 | (uVar29 & 0xff0000) >> 8 | (uVar29 & 0xff00) << 8 |
                               uVar29 << 0x18;
                  uVar29 = puVar16[4];
                  local_1288 = uVar29 >> 0x18 | (uVar29 & 0xff0000) >> 8 | (uVar29 & 0xff00) << 8 |
                               uVar29 << 0x18;
                  local_12a0 = puVar15;
                  if ((long)(ulong)local_1288 <= ((long)puVar24 + (long)puVar13) - (long)local_1280)
                  goto LAB_00177b8c;
                }
              }
            }
LAB_00177cf5:
            (*local_1358)(puVar13,local_1360);
            pUserData = local_1350;
          }
LAB_00177d0b:
          iVar20 = 1;
        }
        break;
      default:
        if (bVar19 == 0x7f) {
          if ((p_Var25 != (ma_dr_flac_seek_proc)0x0) &&
             (mVar9 = (*local_1318)(pUserData,uVar26,ma_dr_flac_seek_origin_current),
             puVar13 = local_1310, puVar14 = local_12f0, mVar9 == 0)) {
            uVar32 = 1;
          }
        }
        else if (p_Var25 != (ma_dr_flac_seek_proc)0x0) {
          if (local_1320 == (_func_void_ptr_size_t_void_ptr *)0x0) {
            if (local_1308 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
              puVar13 = (ulong *)0x0;
            }
            else {
              puVar13 = (ulong *)(*local_1308)((void *)0x0,(size_t)puVar24,local_1360);
            }
          }
          else {
            puVar13 = (ulong *)(*local_1320)((size_t)puVar24,local_1360);
          }
          pUserData = local_1350;
          if (puVar13 != (ulong *)0x0) {
            auVar37 = (*(code *)local_1340)(local_1350,puVar13,puVar24);
            lVar11 = auVar37._8_8_;
            if (auVar37._0_8_ == puVar24) goto LAB_00177b8c;
            goto LAB_00177cf5;
          }
          goto LAB_00177d0b;
        }
LAB_00177bb1:
        local_12f0 = puVar14;
        local_1310 = puVar13;
        if (((p_Var25 == (ma_dr_flac_seek_proc)0x0) && (uVar26 != 0)) &&
           (mVar9 = (*local_1318)(pUserData,uVar26,ma_dr_flac_seek_origin_current), mVar9 == 0)) {
          uVar32 = 1;
        }
        puVar34 = (ulong *)((long)puVar34 + (long)puVar24);
        iVar20 = uVar32 * 2;
      }
LAB_00177be2:
      pmVar12 = local_12f8;
      p_Var35 = local_1320;
    } while (iVar20 == 0);
    bVar36 = iVar20 != 2;
    if (bVar36) {
      local_1310 = (ulong *)0x0;
      local_1338 = (ulong *)0x2a;
      uVar31 = 0;
    }
    else {
      uVar31 = ((ulong)local_12f0 & 0xffffffff) / 0x12;
      local_1338 = puVar34;
    }
    uVar32 = (uint)local_12e8;
    if (bVar36) {
      if (local_12f8 != (ma_dr_flac *)0x0) {
        (*local_1358)(local_12f8,local_1360);
      }
    }
    else {
      uVar32 = uVar32 + (int)uVar31 * 0x18;
    }
    if (bVar36) {
      return (ma_dr_flac *)0x0;
    }
  }
  if (p_Var35 == (_func_void_ptr_size_t_void_ptr *)0x0) {
    if (local_1308 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
      pFlac = (ma_dr_flac *)0x0;
    }
    else {
      pFlac = (ma_dr_flac *)(*local_1308)((void *)0x0,(ulong)uVar32,local_1360);
    }
  }
  else {
    pFlac = (ma_dr_flac *)(*p_Var35)((ulong)uVar32,local_1360);
  }
  p_Var7 = local_1358;
  if (pFlac == (ma_dr_flac *)0x0) {
    pvVar27 = local_1360;
    pFlac = pmVar12;
    if (pmVar12 == (ma_dr_flac *)0x0) {
      return (ma_dr_flac *)0x0;
    }
LAB_0017835d:
    (*p_Var7)(pFlac,pvVar27);
    return (ma_dr_flac *)0x0;
  }
  memset(pFlac,0,0x1188);
  pvVar27 = local_1360;
  local_1340 = &pFlac->bs;
  memcpy(local_1340,&local_1220.bs,0x1050);
  pmVar12 = local_12f8;
  pFlac->onMeta = local_1220.onMeta;
  pFlac->pUserDataMD = local_1220.pUserDataMD;
  pFlac->maxBlockSizeInPCMFrames = local_1220.maxBlockSizeInPCMFrames;
  pFlac->sampleRate = local_1220.sampleRate;
  pFlac->channels = local_1220.channels;
  pFlac->bitsPerSample = local_1220.bitsPerSample;
  pFlac->totalPCMFrameCount = local_1220.totalPCMFrameCount;
  pFlac->container = local_1220.container;
  (pFlac->allocationCallbacks).pUserData = pvVar27;
  (pFlac->allocationCallbacks).onMalloc = p_Var35;
  (pFlac->allocationCallbacks).onRealloc = local_1308;
  (pFlac->allocationCallbacks).onFree = p_Var7;
  pmVar17 = (ma_int32 *)((ulong)((long)&pFlac[1].maxBlockSizeInPCMFrames + 1U) & 0xffffffffffffffc0)
  ;
  pFlac->pDecodedSamples = pmVar17;
  mVar30 = (ma_uint32)uVar31;
  if (local_1220.container == ma_dr_flac_container_ogg) {
    __dest = (void *)((long)pmVar17 + uVar31 * 0x18 + (local_12d8 & 0xffffffff));
    memcpy(__dest,local_12f8,0x10198);
    if (pmVar12 != (ma_dr_flac *)0x0) {
      (*p_Var7)(pmVar12,pvVar27);
    }
    (pFlac->bs).onRead = ma_dr_flac__on_read_ogg;
    (pFlac->bs).onSeek = ma_dr_flac__on_seek_ogg;
    (pFlac->bs).pUserData = __dest;
    pFlac->_oggbs = __dest;
  }
  pFlac->firstFLACFramePosInBytes = (ma_uint64)local_1338;
  if (local_1220.container == ma_dr_flac_container_ogg) {
    pFlac->pSeekpoints = (ma_dr_flac_seekpoint *)0x0;
  }
  else {
    if (local_1310 == (ulong *)0x0) goto LAB_00178496;
    pFlac->seekpointCount = mVar30;
    pFlac->pSeekpoints =
         (ma_dr_flac_seekpoint *)((local_12d8 & 0xffffffff) + (long)pFlac->pDecodedSamples);
    mVar9 = (*(pFlac->bs).onSeek)
                      ((pFlac->bs).pUserData,(int)local_1310,ma_dr_flac_seek_origin_start);
    if (mVar9 != 0) {
      if (mVar30 != 0) {
        lVar11 = 0;
        do {
          sVar18 = (*(pFlac->bs).onRead)
                             ((pFlac->bs).pUserData,
                              (void *)((long)&pFlac->pSeekpoints->firstPCMFrame + lVar11),0x12);
          if (sVar18 != 0x12) {
            pFlac->pSeekpoints = (ma_dr_flac_seekpoint *)0x0;
            pFlac->seekpointCount = 0;
            break;
          }
          pmVar4 = pFlac->pSeekpoints;
          uVar31 = *(ulong *)((long)&pmVar4->firstPCMFrame + lVar11);
          uVar5 = *(ulong *)((long)&pmVar4->flacFrameOffset + lVar11);
          *(ulong *)((long)&pmVar4->firstPCMFrame + lVar11) =
               uVar31 >> 0x38 | (uVar31 & 0xff000000000000) >> 0x28 |
               (uVar31 & 0xff0000000000) >> 0x18 | (uVar31 & 0xff00000000) >> 8 |
               (uVar31 & 0xff000000) << 8 | (uVar31 & 0xff0000) << 0x18 | (uVar31 & 0xff00) << 0x28
               | uVar31 << 0x38;
          *(ulong *)((long)&pmVar4->flacFrameOffset + lVar11) =
               uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18
               | (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 |
               (uVar5 & 0xff0000) << 0x18 | (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
          puVar2 = (ushort *)((long)&pmVar4->pcmFrameCount + lVar11);
          *puVar2 = *puVar2 << 8 | *puVar2 >> 8;
          lVar11 = lVar11 + 0x18;
        } while ((ulong)(mVar30 << 3) * 3 != lVar11);
      }
      mVar9 = (*(pFlac->bs).onSeek)
                        ((pFlac->bs).pUserData,(int)pFlac->firstFLACFramePosInBytes,
                         ma_dr_flac_seek_origin_start);
      if (mVar9 == 0) goto LAB_0017835d;
      goto LAB_00178496;
    }
    pFlac->pSeekpoints = (ma_dr_flac_seekpoint *)0x0;
  }
  pFlac->seekpointCount = 0;
LAB_00178496:
  bs = local_1340;
  if (local_1220.hasStreamInfoBlock != 0) {
    return pFlac;
  }
  (pFlac->currentFLACFrame).header.blockSizeInPCMFrames =
       local_1220.firstFrameHeader.blockSizeInPCMFrames;
  (pFlac->currentFLACFrame).header.channelAssignment = local_1220.firstFrameHeader.channelAssignment
  ;
  (pFlac->currentFLACFrame).header.bitsPerSample = local_1220.firstFrameHeader.bitsPerSample;
  (pFlac->currentFLACFrame).header.crc8 = local_1220.firstFrameHeader.crc8;
  *(undefined3 *)&(pFlac->currentFLACFrame).header.field_0x15 = local_1220.firstFrameHeader._21_3_;
  (pFlac->currentFLACFrame).header.pcmFrameNumber = local_1220.firstFrameHeader.pcmFrameNumber;
  (pFlac->currentFLACFrame).header.flacFrameNumber = local_1220.firstFrameHeader.flacFrameNumber;
  (pFlac->currentFLACFrame).header.sampleRate = local_1220.firstFrameHeader.sampleRate;
  do {
    mVar10 = ma_dr_flac__decode_flac_frame(pFlac);
    if (mVar10 == MA_SUCCESS) {
      iVar20 = 5;
    }
    else {
      if (mVar10 == MA_CRC_MISMATCH) {
        mVar9 = ma_dr_flac__read_next_flac_frame_header
                          (bs,pFlac->bitsPerSample,&(pFlac->currentFLACFrame).header);
        iVar20 = 6;
        if (mVar9 != 0) goto LAB_001784fe;
      }
      (*p_Var7)(pFlac,pvVar27);
      iVar20 = 1;
    }
LAB_001784fe:
    if (iVar20 != 6) {
      if (iVar20 != 5) {
        return (ma_dr_flac *)0x0;
      }
      return pFlac;
    }
  } while( true );
}

Assistant:

static ma_dr_flac* ma_dr_flac_open_with_metadata_private(ma_dr_flac_read_proc onRead, ma_dr_flac_seek_proc onSeek, ma_dr_flac_meta_proc onMeta, ma_dr_flac_container container, void* pUserData, void* pUserDataMD, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_dr_flac_init_info init;
    ma_uint32 allocationSize;
    ma_uint32 wholeSIMDVectorCountPerChannel;
    ma_uint32 decodedSamplesAllocationSize;
#ifndef MA_DR_FLAC_NO_OGG
    ma_dr_flac_oggbs* pOggbs = NULL;
#endif
    ma_uint64 firstFramePos;
    ma_uint64 seektablePos;
    ma_uint32 seekpointCount;
    ma_allocation_callbacks allocationCallbacks;
    ma_dr_flac* pFlac;
    ma_dr_flac__init_cpu_caps();
    if (!ma_dr_flac__init_private(&init, onRead, onSeek, onMeta, container, pUserData, pUserDataMD)) {
        return NULL;
    }
    if (pAllocationCallbacks != NULL) {
        allocationCallbacks = *pAllocationCallbacks;
        if (allocationCallbacks.onFree == NULL || (allocationCallbacks.onMalloc == NULL && allocationCallbacks.onRealloc == NULL)) {
            return NULL;
        }
    } else {
        allocationCallbacks.pUserData = NULL;
        allocationCallbacks.onMalloc  = ma_dr_flac__malloc_default;
        allocationCallbacks.onRealloc = ma_dr_flac__realloc_default;
        allocationCallbacks.onFree    = ma_dr_flac__free_default;
    }
    allocationSize = sizeof(ma_dr_flac);
    if ((init.maxBlockSizeInPCMFrames % (MA_DR_FLAC_MAX_SIMD_VECTOR_SIZE / sizeof(ma_int32))) == 0) {
        wholeSIMDVectorCountPerChannel = (init.maxBlockSizeInPCMFrames / (MA_DR_FLAC_MAX_SIMD_VECTOR_SIZE / sizeof(ma_int32)));
    } else {
        wholeSIMDVectorCountPerChannel = (init.maxBlockSizeInPCMFrames / (MA_DR_FLAC_MAX_SIMD_VECTOR_SIZE / sizeof(ma_int32))) + 1;
    }
    decodedSamplesAllocationSize = wholeSIMDVectorCountPerChannel * MA_DR_FLAC_MAX_SIMD_VECTOR_SIZE * init.channels;
    allocationSize += decodedSamplesAllocationSize;
    allocationSize += MA_DR_FLAC_MAX_SIMD_VECTOR_SIZE;
#ifndef MA_DR_FLAC_NO_OGG
    if (init.container == ma_dr_flac_container_ogg) {
        allocationSize += sizeof(ma_dr_flac_oggbs);
        pOggbs = (ma_dr_flac_oggbs*)ma_dr_flac__malloc_from_callbacks(sizeof(*pOggbs), &allocationCallbacks);
        if (pOggbs == NULL) {
            return NULL;
        }
        MA_DR_FLAC_ZERO_MEMORY(pOggbs, sizeof(*pOggbs));
        pOggbs->onRead = onRead;
        pOggbs->onSeek = onSeek;
        pOggbs->pUserData = pUserData;
        pOggbs->currentBytePos = init.oggFirstBytePos;
        pOggbs->firstBytePos = init.oggFirstBytePos;
        pOggbs->serialNumber = init.oggSerial;
        pOggbs->bosPageHeader = init.oggBosHeader;
        pOggbs->bytesRemainingInPage = 0;
    }
#endif
    firstFramePos  = 42;
    seektablePos   = 0;
    seekpointCount = 0;
    if (init.hasMetadataBlocks) {
        ma_dr_flac_read_proc onReadOverride = onRead;
        ma_dr_flac_seek_proc onSeekOverride = onSeek;
        void* pUserDataOverride = pUserData;
#ifndef MA_DR_FLAC_NO_OGG
        if (init.container == ma_dr_flac_container_ogg) {
            onReadOverride = ma_dr_flac__on_read_ogg;
            onSeekOverride = ma_dr_flac__on_seek_ogg;
            pUserDataOverride = (void*)pOggbs;
        }
#endif
        if (!ma_dr_flac__read_and_decode_metadata(onReadOverride, onSeekOverride, onMeta, pUserDataOverride, pUserDataMD, &firstFramePos, &seektablePos, &seekpointCount, &allocationCallbacks)) {
        #ifndef MA_DR_FLAC_NO_OGG
            ma_dr_flac__free_from_callbacks(pOggbs, &allocationCallbacks);
        #endif
            return NULL;
        }
        allocationSize += seekpointCount * sizeof(ma_dr_flac_seekpoint);
    }
    pFlac = (ma_dr_flac*)ma_dr_flac__malloc_from_callbacks(allocationSize, &allocationCallbacks);
    if (pFlac == NULL) {
    #ifndef MA_DR_FLAC_NO_OGG
        ma_dr_flac__free_from_callbacks(pOggbs, &allocationCallbacks);
    #endif
        return NULL;
    }
    ma_dr_flac__init_from_info(pFlac, &init);
    pFlac->allocationCallbacks = allocationCallbacks;
    pFlac->pDecodedSamples = (ma_int32*)ma_dr_flac_align((size_t)pFlac->pExtraData, MA_DR_FLAC_MAX_SIMD_VECTOR_SIZE);
#ifndef MA_DR_FLAC_NO_OGG
    if (init.container == ma_dr_flac_container_ogg) {
        ma_dr_flac_oggbs* pInternalOggbs = (ma_dr_flac_oggbs*)((ma_uint8*)pFlac->pDecodedSamples + decodedSamplesAllocationSize + (seekpointCount * sizeof(ma_dr_flac_seekpoint)));
        MA_DR_FLAC_COPY_MEMORY(pInternalOggbs, pOggbs, sizeof(*pOggbs));
        ma_dr_flac__free_from_callbacks(pOggbs, &allocationCallbacks);
        pOggbs = NULL;
        pFlac->bs.onRead = ma_dr_flac__on_read_ogg;
        pFlac->bs.onSeek = ma_dr_flac__on_seek_ogg;
        pFlac->bs.pUserData = (void*)pInternalOggbs;
        pFlac->_oggbs = (void*)pInternalOggbs;
    }
#endif
    pFlac->firstFLACFramePosInBytes = firstFramePos;
#ifndef MA_DR_FLAC_NO_OGG
    if (init.container == ma_dr_flac_container_ogg)
    {
        pFlac->pSeekpoints = NULL;
        pFlac->seekpointCount = 0;
    }
    else
#endif
    {
        if (seektablePos != 0) {
            pFlac->seekpointCount = seekpointCount;
            pFlac->pSeekpoints = (ma_dr_flac_seekpoint*)((ma_uint8*)pFlac->pDecodedSamples + decodedSamplesAllocationSize);
            MA_DR_FLAC_ASSERT(pFlac->bs.onSeek != NULL);
            MA_DR_FLAC_ASSERT(pFlac->bs.onRead != NULL);
            if (pFlac->bs.onSeek(pFlac->bs.pUserData, (int)seektablePos, ma_dr_flac_seek_origin_start)) {
                ma_uint32 iSeekpoint;
                for (iSeekpoint = 0; iSeekpoint < seekpointCount; iSeekpoint += 1) {
                    if (pFlac->bs.onRead(pFlac->bs.pUserData, pFlac->pSeekpoints + iSeekpoint, MA_DR_FLAC_SEEKPOINT_SIZE_IN_BYTES) == MA_DR_FLAC_SEEKPOINT_SIZE_IN_BYTES) {
                        pFlac->pSeekpoints[iSeekpoint].firstPCMFrame   = ma_dr_flac__be2host_64(pFlac->pSeekpoints[iSeekpoint].firstPCMFrame);
                        pFlac->pSeekpoints[iSeekpoint].flacFrameOffset = ma_dr_flac__be2host_64(pFlac->pSeekpoints[iSeekpoint].flacFrameOffset);
                        pFlac->pSeekpoints[iSeekpoint].pcmFrameCount   = ma_dr_flac__be2host_16(pFlac->pSeekpoints[iSeekpoint].pcmFrameCount);
                    } else {
                        pFlac->pSeekpoints = NULL;
                        pFlac->seekpointCount = 0;
                        break;
                    }
                }
                if (!pFlac->bs.onSeek(pFlac->bs.pUserData, (int)pFlac->firstFLACFramePosInBytes, ma_dr_flac_seek_origin_start)) {
                    ma_dr_flac__free_from_callbacks(pFlac, &allocationCallbacks);
                    return NULL;
                }
            } else {
                pFlac->pSeekpoints = NULL;
                pFlac->seekpointCount = 0;
            }
        }
    }
    if (!init.hasStreamInfoBlock) {
        pFlac->currentFLACFrame.header = init.firstFrameHeader;
        for (;;) {
            ma_result result = ma_dr_flac__decode_flac_frame(pFlac);
            if (result == MA_SUCCESS) {
                break;
            } else {
                if (result == MA_CRC_MISMATCH) {
                    if (!ma_dr_flac__read_next_flac_frame_header(&pFlac->bs, pFlac->bitsPerSample, &pFlac->currentFLACFrame.header)) {
                        ma_dr_flac__free_from_callbacks(pFlac, &allocationCallbacks);
                        return NULL;
                    }
                    continue;
                } else {
                    ma_dr_flac__free_from_callbacks(pFlac, &allocationCallbacks);
                    return NULL;
                }
            }
        }
    }
    return pFlac;
}